

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_opn2.cpp
# Opt level: O1

void __thiscall OPN2::commitLFOSetup(OPN2 *this)

{
  long *plVar1;
  byte bVar2;
  undefined8 in_RAX;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar4;
  ulong uVar5;
  undefined8 uVar3;
  
  uVar5 = CONCAT71((int7)((ulong)in_RAX >> 8),this->m_lfoFrequency) & 0xffffffffffffff07;
  bVar2 = (byte)uVar5 | this->m_lfoEnable << 3;
  uVar3 = CONCAT71((int7)(uVar5 >> 8),bVar2);
  this->m_regLFOSetup = bVar2;
  if (this->m_numChips != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      plVar1 = *(long **)((long)&((this->m_chips).
                                  super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_p + lVar4);
      (**(code **)(*plVar1 + 0x58))(plVar1,0,0x22,bVar2,in_R8,in_R9,uVar3);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < this->m_numChips);
  }
  return;
}

Assistant:

void OPN2::commitLFOSetup()
{
    uint8_t regLFOSetup = (m_lfoEnable ? 8 : 0) | (m_lfoFrequency & 7);
    m_regLFOSetup = regLFOSetup;
    for(size_t chip = 0; chip < m_numChips; ++chip)
        writeReg(chip, 0, 0x22, regLFOSetup);
}